

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintdevice.cpp
# Opt level: O0

void __thiscall
QOpenGLPaintDevicePrivate::QOpenGLPaintDevicePrivate(QOpenGLPaintDevicePrivate *this,QSize *sz)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__QOpenGLPaintDevicePrivate_00213b90;
  in_RDI[1] = *in_RSI;
  uVar2 = QOpenGLContext::currentContext();
  in_RDI[2] = uVar2;
  iVar1 = qt_defaultDpiX();
  in_RDI[3] = ((double)iVar1 * 100.0) / 2.54;
  iVar1 = qt_defaultDpiY();
  in_RDI[4] = ((double)iVar1 * 100.0) / 2.54;
  in_RDI[5] = 0x3ff0000000000000;
  *(undefined1 *)(in_RDI + 6) = 0;
  in_RDI[7] = 0;
  return;
}

Assistant:

QOpenGLPaintDevicePrivate::QOpenGLPaintDevicePrivate(const QSize &sz)
    : size(sz)
    , ctx(QOpenGLContext::currentContext())
    , dpmx(qt_defaultDpiX() * 100. / 2.54)
    , dpmy(qt_defaultDpiY() * 100. / 2.54)
    , devicePixelRatio(1.0)
    , flipped(false)
    , engine(nullptr)
{
}